

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.h
# Opt level: O1

void __thiscall
slang::ast::HierarchyOverrideNode::~HierarchyOverrideNode(HierarchyOverrideNode *this)

{
  pointer p;
  
  p = (this->binds).
      super__Vector_base<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start;
  if (p != (pointer)0x0) {
    operator_delete(p,(long)(this->binds).
                            super__Vector_base<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)p);
  }
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ast::OpaqueInstancePath::Entry,_void>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ast::OpaqueInstancePath::Entry,_void>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                 *)&this->childNodes);
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                 *)this);
  return;
}

Assistant:

struct SLANG_EXPORT HierarchyOverrideNode {
    /// A map of parameters in the current scope to override.
    /// The key is the syntax node representing the parameter and the value is a pair,
    /// the first element of which is the value to set the parameter to and the second
    /// is the source defparam doing the overriding, if any (can be null).
    flat_hash_map<const syntax::SyntaxNode*, std::pair<ConstantValue, const syntax::SyntaxNode*>>
        paramOverrides;

    /// A map of child scopes that also contain overrides.
    flat_hash_map<OpaqueInstancePath::Entry, HierarchyOverrideNode> childNodes;

    /// A list of bind directives to apply in this scope.
    /// The first entry is info about the bind instantiation, and the
    /// second is an optional pointer to the definition it targets.
    /// If the target is null, then the bind is actually targeting the
    /// scope represented by this override node.
    std::vector<std::pair<BindDirectiveInfo, const syntax::SyntaxNode*>> binds;
}